

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsGenerators.cpp
# Opt level: O2

void __thiscall
chrono::utils::MixtureIngredient::setDefaultMaterial
          (MixtureIngredient *this,shared_ptr<chrono::ChMaterialSurface> *mat)

{
  int iVar1;
  int iVar2;
  __shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2> local_30;
  
  iVar1 = (*((mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
            )->_vptr_ChMaterialSurface[3])();
  iVar2 = (*(this->m_generator->m_system->super_ChIntegrableIIorder).super_ChIntegrable.
            _vptr_ChIntegrable[0x2f])();
  if (iVar1 == iVar2) {
    iVar1 = (*((mat->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
              _M_ptr)->_vptr_ChMaterialSurface[3])();
    if (iVar1 == 0) {
      std::static_pointer_cast<chrono::ChMaterialSurfaceNSC,chrono::ChMaterialSurface>
                ((shared_ptr<chrono::ChMaterialSurface> *)&local_30);
      std::__shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->m_defMaterialNSC).
                  super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2> *)&local_30
                );
    }
    else {
      std::static_pointer_cast<chrono::ChMaterialSurfaceSMC,chrono::ChMaterialSurface>
                ((shared_ptr<chrono::ChMaterialSurface> *)&local_30);
      std::__shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->m_defMaterialSMC).
                  super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>,
                 &local_30);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
    freeMaterialDist(this);
    return;
  }
  __assert_fail("mat->GetContactMethod() == m_generator->m_system->GetContactMethod()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/utils/ChUtilsGenerators.cpp"
                ,0x39,
                "void chrono::utils::MixtureIngredient::setDefaultMaterial(std::shared_ptr<ChMaterialSurface>)"
               );
}

Assistant:

void MixtureIngredient::setDefaultMaterial(std::shared_ptr<ChMaterialSurface> mat) {
    assert(mat->GetContactMethod() == m_generator->m_system->GetContactMethod());

    if (mat->GetContactMethod() == ChContactMethod::NSC) {
        m_defMaterialNSC = std::static_pointer_cast<ChMaterialSurfaceNSC>(mat);
    } else {
        m_defMaterialSMC = std::static_pointer_cast<ChMaterialSurfaceSMC>(mat);
    }

    freeMaterialDist();
}